

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBroadphaseProxy.h
# Opt level: O0

void __thiscall
btBroadphaseProxy::btBroadphaseProxy
          (btBroadphaseProxy *this,btVector3 *aabbMin,btVector3 *aabbMax,void *userPtr,
          short collisionFilterGroup,short collisionFilterMask,void *multiSapParentProxy)

{
  short collisionFilterMask_local;
  short collisionFilterGroup_local;
  void *userPtr_local;
  btVector3 *aabbMax_local;
  btVector3 *aabbMin_local;
  btBroadphaseProxy *this_local;
  
  this->m_clientObject = userPtr;
  this->m_collisionFilterGroup = collisionFilterGroup;
  this->m_collisionFilterMask = collisionFilterMask;
  *(undefined8 *)(this->m_aabbMin).m_floats = *(undefined8 *)aabbMin->m_floats;
  *(undefined8 *)((this->m_aabbMin).m_floats + 2) = *(undefined8 *)(aabbMin->m_floats + 2);
  *(undefined8 *)(this->m_aabbMax).m_floats = *(undefined8 *)aabbMax->m_floats;
  *(undefined8 *)((this->m_aabbMax).m_floats + 2) = *(undefined8 *)(aabbMax->m_floats + 2);
  this->m_multiSapParentProxy = multiSapParentProxy;
  return;
}

Assistant:

btBroadphaseProxy(const btVector3& aabbMin,const btVector3& aabbMax,void* userPtr,short int collisionFilterGroup, short int collisionFilterMask,void* multiSapParentProxy=0)
		:m_clientObject(userPtr),
		m_collisionFilterGroup(collisionFilterGroup),
		m_collisionFilterMask(collisionFilterMask),
		m_aabbMin(aabbMin),
		m_aabbMax(aabbMax)
	{
		m_multiSapParentProxy = multiSapParentProxy;
	}